

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O3

void __thiscall VGMPlayer::Cmd_AY_Stereo(VGMPlayer *this)

{
  UINT8 chipType;
  
  chipType = '\x06';
  if ((this->_fileData[(ulong)this->_filePos + 1] & 0x40) == 0) {
    chipType = '\x12';
  }
  GetDevicePtr(this,chipType,this->_fileData[(ulong)this->_filePos + 1] >> 7);
  return;
}

Assistant:

void VGMPlayer::Cmd_AY_Stereo(void)
{
	UINT8 chipType = (fData[0x01] & 0x40) ? 0x06 : 0x12;	// YM2203 SSG or AY8910
	UINT8 chipID = (fData[0x01] & 0x80) >> 7;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->write8 == NULL)
		return;
	
	// TODO: assign a register or do a special function call
	//cDev->write8(cDev->base.defInf.dataPtr, 0xFF, fData[0x01] & 0x3F);
	return;
}